

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexMerge(Fts5Index *p,Fts5Structure **ppStruct,int nPg,int nMin)

{
  Fts5StructureLevel *pFVar1;
  bool bVar2;
  Fts5StructureLevel *pLvl;
  int local_38;
  int nBest;
  int iBestLvl;
  int iLvl;
  Fts5Structure *pStruct;
  int bRet;
  int nRem;
  int nMin_local;
  int nPg_local;
  Fts5Structure **ppStruct_local;
  Fts5Index *p_local;
  
  pStruct._0_4_ = 0;
  _iBestLvl = *ppStruct;
  pStruct._4_4_ = nPg;
  bRet = nMin;
  nRem = nPg;
  _nMin_local = ppStruct;
  ppStruct_local = (Fts5Structure **)p;
  while( true ) {
    bVar2 = false;
    if (0 < pStruct._4_4_) {
      bVar2 = *(int *)((long)ppStruct_local + 0x34) == 0;
    }
    if (!bVar2) break;
    local_38 = 0;
    pLvl._4_4_ = 0;
    for (nBest = 0; nBest < _iBestLvl->nLevel; nBest = nBest + 1) {
      pFVar1 = _iBestLvl->aLevel + nBest;
      if (pFVar1->nMerge != 0) {
        if (pLvl._4_4_ < pFVar1->nMerge) {
          local_38 = nBest;
          pLvl._4_4_ = pFVar1->nMerge;
        }
        break;
      }
      if (pLvl._4_4_ < pFVar1->nSeg) {
        pLvl._4_4_ = pFVar1->nSeg;
        local_38 = nBest;
      }
    }
    if ((pLvl._4_4_ < bRet) && (_iBestLvl->aLevel[local_38].nMerge == 0)) break;
    pStruct._0_4_ = 1;
    fts5IndexMergeLevel((Fts5Index *)ppStruct_local,(Fts5Structure **)&iBestLvl,local_38,
                        (int *)((long)&pStruct + 4));
    if ((*(int *)((long)ppStruct_local + 0x34) == 0) && (_iBestLvl->aLevel[local_38].nMerge == 0)) {
      fts5StructurePromote((Fts5Index *)ppStruct_local,local_38 + 1,_iBestLvl);
    }
  }
  *_nMin_local = _iBestLvl;
  return (int)pStruct;
}

Assistant:

static int fts5IndexMerge(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Current structure of index */
  int nPg,                        /* Pages of work to do */
  int nMin                        /* Minimum number of segments to merge */
){
  int nRem = nPg;
  int bRet = 0;
  Fts5Structure *pStruct = *ppStruct;
  while( nRem>0 && p->rc==SQLITE_OK ){
    int iLvl;                   /* To iterate through levels */
    int iBestLvl = 0;           /* Level offering the most input segments */
    int nBest = 0;              /* Number of input segments on best level */

    /* Set iBestLvl to the level to read input segments from. */
    assert( pStruct->nLevel>0 );
    for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
      if( pLvl->nMerge ){
        if( pLvl->nMerge>nBest ){
          iBestLvl = iLvl;
          nBest = pLvl->nMerge;
        }
        break;
      }
      if( pLvl->nSeg>nBest ){
        nBest = pLvl->nSeg;
        iBestLvl = iLvl;
      }
    }

    /* If nBest is still 0, then the index must be empty. */
#ifdef SQLITE_DEBUG
    for(iLvl=0; nBest==0 && iLvl<pStruct->nLevel; iLvl++){
      assert( pStruct->aLevel[iLvl].nSeg==0 );
    }
#endif

    if( nBest<nMin && pStruct->aLevel[iBestLvl].nMerge==0 ){
      break;
    }
    bRet = 1;
    fts5IndexMergeLevel(p, &pStruct, iBestLvl, &nRem);
    if( p->rc==SQLITE_OK && pStruct->aLevel[iBestLvl].nMerge==0 ){
      fts5StructurePromote(p, iBestLvl+1, pStruct);
    }
  }
  *ppStruct = pStruct;
  return bRet;
}